

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::AMFImporter::PostprocessHelper_CreateMeshDataArray
          (AMFImporter *this,CAMFImporter_NodeElement_Mesh *pNodeElement,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray,
          vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
          *pVertexColorArray)

{
  EType EVar1;
  long lVar2;
  CAMFImporter_NodeElement_Color *pCVar3;
  _List_node_base *p_Var4;
  long *plVar5;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  iterator __end1;
  
  plVar6 = &(pNodeElement->super_CAMFImporter_NodeElement).Child;
  p_Var4 = (_List_node_base *)plVar6;
  lVar9 = 0;
  while (p_Var4 = (((_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar6) {
    if (*(int *)((long)p_Var4[1]._M_next + 8) == 0xe) {
      lVar9 = (long)p_Var4[1]._M_next;
    }
  }
  if (lVar9 != 0) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (pVertexCoordinateArray,*(size_type *)(lVar9 + 0x48));
    std::vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
    ::resize(pVertexColorArray,*(size_type *)(lVar9 + 0x48));
    lVar7 = 0;
    plVar8 = (long *)(lVar9 + 0x38);
    while (plVar8 = (long *)*plVar8, plVar8 != (long *)(lVar9 + 0x38)) {
      lVar2 = plVar8[2];
      if (*(int *)(lVar2 + 8) == 0xd) {
        (pVertexColorArray->
        super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar7] = (CAMFImporter_NodeElement_Color *)0x0;
        plVar10 = (long *)(lVar2 + 0x38);
        plVar5 = plVar10;
        while (plVar5 = (long *)*plVar5, plVar5 != plVar10) {
          pCVar3 = (CAMFImporter_NodeElement_Color *)plVar5[2];
          EVar1 = (pCVar3->super_CAMFImporter_NodeElement).Type;
          if (EVar1 == ENET_Color) {
            (pVertexColorArray->
            super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
            )._M_impl.super__Vector_impl_data._M_start[lVar7] = pCVar3;
          }
          else if (EVar1 == ENET_Coordinates) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      (pVertexCoordinateArray,(value_type *)&pCVar3->Composed);
          }
        }
        lVar7 = lVar7 + 1;
      }
    }
  }
  return;
}

Assistant:

void AMFImporter::PostprocessHelper_CreateMeshDataArray(const CAMFImporter_NodeElement_Mesh& pNodeElement, std::vector<aiVector3D>& pVertexCoordinateArray,
														std::vector<CAMFImporter_NodeElement_Color*>& pVertexColorArray) const
{
    CAMFImporter_NodeElement_Vertices* vn = nullptr;
    size_t col_idx;

	// All data stored in "vertices", search for it.
	for(CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Vertices) vn = (CAMFImporter_NodeElement_Vertices*)ne_child;
	}

	// If "vertices" not found then no work for us.
	if(vn == nullptr) return;

	pVertexCoordinateArray.reserve(vn->Child.size());// all coordinates stored as child and we need to reserve space for future push_back's.
	pVertexColorArray.resize(vn->Child.size());// colors count equal vertices count.
	col_idx = 0;
	// Inside vertices collect all data and place to arrays
	for(CAMFImporter_NodeElement* vn_child: vn->Child)
	{
		// vertices, colors
		if(vn_child->Type == CAMFImporter_NodeElement::ENET_Vertex)
		{
			// by default clear color for current vertex
			pVertexColorArray[col_idx] = nullptr;

			for(CAMFImporter_NodeElement* vtx: vn_child->Child)
			{
				if(vtx->Type == CAMFImporter_NodeElement::ENET_Coordinates)
				{
					pVertexCoordinateArray.push_back(((CAMFImporter_NodeElement_Coordinates*)vtx)->Coordinate);

					continue;
				}

				if(vtx->Type == CAMFImporter_NodeElement::ENET_Color)
				{
					pVertexColorArray[col_idx] = (CAMFImporter_NodeElement_Color*)vtx;

					continue;
				}
			}// for(CAMFImporter_NodeElement* vtx: vn_child->Child)

			col_idx++;
		}// if(vn_child->Type == CAMFImporter_NodeElement::ENET_Vertex)
	}// for(CAMFImporter_NodeElement* vn_child: vn->Child)
}